

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall
cmCTestScriptHandler::ReadInScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  cmCTest *this_00;
  string_view value;
  bool bVar1;
  pointer pcVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  char *msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  reference name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *d;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *defs;
  undefined1 local_480 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string systemFile;
  function<void_()> local_2b8;
  string_view local_298;
  allocator<char> local_281;
  string local_280;
  string_view local_260;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string_view local_200;
  allocator<char> local_1e9;
  string local_1e8;
  string_view local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  string_view local_170;
  allocator<char> local_159;
  string local_158;
  string local_138;
  string_view local_118;
  allocator<char> local_101;
  string local_100;
  undefined4 local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [48];
  string local_88 [32];
  long local_68;
  size_type comma_pos;
  string script_arg;
  string script;
  string *total_script_arg_local;
  cmCTestScriptHandler *this_local;
  
  cmSystemTools::ResetErrorOccurredFlag();
  std::__cxx11::string::string((string *)(script_arg.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&comma_pos);
  local_68 = std::__cxx11::string::find((char)total_script_arg,0x2c);
  if (local_68 == -1) {
    std::__cxx11::string::operator=
              ((string *)(script_arg.field_2._M_local_buf + 8),(string *)total_script_arg);
  }
  else {
    std::__cxx11::string::substr((ulong)local_88,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)(script_arg.field_2._M_local_buf + 8),local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::substr((ulong)local_b8,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)&comma_pos,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  bVar1 = cmsys::SystemTools::FileExists((string *)((long)&script_arg.field_2 + 8));
  if (!bVar1) {
    std::operator+(&local_d8,"Cannot find file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&script_arg.field_2 + 8));
    cmSystemTools::Error(&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    this_local._4_4_ = 1;
    local_dc = 1;
    goto LAB_009f13ee;
  }
  CreateCMake(this);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"CTEST_SCRIPT_DIRECTORY",&local_101);
  cmsys::SystemTools::GetFilenamePath(&local_138,(string *)((long)&script_arg.field_2 + 8));
  local_118 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_138);
  cmMakefile::AddDefinition(pcVar2,&local_100,local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CTEST_SCRIPT_NAME",&local_159);
  cmsys::SystemTools::GetFilenameName(&local_190,(string *)((long)&script_arg.field_2 + 8));
  local_170 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190);
  cmMakefile::AddDefinition(pcVar2,&local_158,local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"CTEST_EXECUTABLE_NAME",&local_1b1);
  psVar3 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  local_1c8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
  cmMakefile::AddDefinition(pcVar2,&local_1b0,local_1c8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CMAKE_EXECUTABLE_NAME",&local_1e9);
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  local_200 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
  cmMakefile::AddDefinition(pcVar2,&local_1e8,local_200);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"CTEST_RUN_CURRENT_SCRIPT",&local_221);
  cmMakefile::AddDefinitionBool(pcVar2,&local_220,true);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  SetRunCurrentScript(this,true);
  UpdateElapsedTime(this);
  cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CTEST_CONFIGURATION_TYPE",&local_249);
    psVar3 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    local_260 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    cmMakefile::AddDefinition(pcVar2,&local_248,local_260);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"CTEST_SCRIPT_ARG",&local_281);
    local_298 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&comma_pos);
    cmMakefile::AddDefinition(pcVar2,&local_280,local_298);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  systemFile.field_2._8_8_ = this;
  std::function<void()>::
  function<cmCTestScriptHandler::ReadInScript(std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_2b8,
             (anon_class_8_1_8991fb9c *)((long)&systemFile.field_2 + 8));
  cmMakefile::OnExecuteCommand(pcVar2,&local_2b8);
  std::function<void_()>::~function(&local_2b8);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"CTestScriptMode.cmake",&local_301);
  cmMakefile::GetModulesFile((string *)local_2e0,pcVar2,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  bVar1 = cmMakefile::ReadListFile(pcVar2,(string *)local_2e0);
  if (bVar1) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) goto LAB_009f10b7;
    this_01 = cmCTest::GetDefinitions_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_01);
    d = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(this_01);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&d);
      if (!bVar1) break;
      name = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
      pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         (&this->Makefile);
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&name->second);
      cmMakefile::AddDefinition(pcVar2,&name->first,value);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       (&this->Makefile);
    bVar1 = cmMakefile::ReadListFile(pcVar2,(string *)((long)&script_arg.field_2 + 8));
    if (bVar1) {
      bVar1 = cmSystemTools::GetErrorOccurredFlag();
      if (bVar1) goto LAB_009f13a7;
      this_local._4_4_ = 0;
    }
    else {
LAB_009f13a7:
      cmSystemTools::ResetErrorOccurredFlag();
      this_local._4_4_ = 2;
    }
  }
  else {
LAB_009f10b7:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
    poVar5 = std::operator<<((ostream *)local_480,"Error in read:");
    poVar5 = std::operator<<(poVar5,(string *)local_2e0);
    std::operator<<(poVar5,"\n");
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x15a,msg,false);
    std::__cxx11::string::~string((string *)&defs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
    this_local._4_4_ = 2;
  }
  local_dc = 1;
  std::__cxx11::string::~string((string *)local_2e0);
LAB_009f13ee:
  std::__cxx11::string::~string((string *)&comma_pos);
  std::__cxx11::string::~string((string *)(script_arg.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::ReadInScript(const std::string& total_script_arg)
{
  // Reset the error flag so that the script is read in no matter what
  cmSystemTools::ResetErrorOccurredFlag();

  // if the argument has a , in it then it needs to be broken into the fist
  // argument (which is the script) and the second argument which will be
  // passed into the scripts as S_ARG
  std::string script;
  std::string script_arg;
  const std::string::size_type comma_pos = total_script_arg.find(',');
  if (comma_pos != std::string::npos) {
    script = total_script_arg.substr(0, comma_pos);
    script_arg = total_script_arg.substr(comma_pos + 1);
  } else {
    script = total_script_arg;
  }
  // make sure the file exists
  if (!cmSystemTools::FileExists(script)) {
    cmSystemTools::Error("Cannot find file: " + script);
    return 1;
  }

  // read in the list file to fill the cache
  // create a cmake instance to read the configuration script
  this->CreateCMake();

  // set a variable with the path to the current script
  this->Makefile->AddDefinition("CTEST_SCRIPT_DIRECTORY",
                                cmSystemTools::GetFilenamePath(script));
  this->Makefile->AddDefinition("CTEST_SCRIPT_NAME",
                                cmSystemTools::GetFilenameName(script));
  this->Makefile->AddDefinition("CTEST_EXECUTABLE_NAME",
                                cmSystemTools::GetCTestCommand());
  this->Makefile->AddDefinition("CMAKE_EXECUTABLE_NAME",
                                cmSystemTools::GetCMakeCommand());
  this->Makefile->AddDefinitionBool("CTEST_RUN_CURRENT_SCRIPT", true);
  this->SetRunCurrentScript(true);
  this->UpdateElapsedTime();

  // set the CTEST_CONFIGURATION_TYPE variable to the current value of the
  // the -C argument on the command line.
  if (!this->CTest->GetConfigType().empty()) {
    this->Makefile->AddDefinition("CTEST_CONFIGURATION_TYPE",
                                  this->CTest->GetConfigType());
  }

  // add the script arg if defined
  if (!script_arg.empty()) {
    this->Makefile->AddDefinition("CTEST_SCRIPT_ARG", script_arg);
  }

#if defined(__CYGWIN__)
  this->Makefile->AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  // set a callback function to update the elapsed time
  this->Makefile->OnExecuteCommand([this] { this->UpdateElapsedTime(); });

  /* Execute CTestScriptMode.cmake, which loads CMakeDetermineSystem and
  CMakeSystemSpecificInformation, so
  that variables like CMAKE_SYSTEM and also the search paths for libraries,
  header and executables are set correctly and can be used. Makes new-style
  ctest scripting easier. */
  std::string systemFile =
    this->Makefile->GetModulesFile("CTestScriptMode.cmake");
  if (!this->Makefile->ReadListFile(systemFile) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in read:" << systemFile << "\n");
    return 2;
  }

  // Add definitions of variables passed in on the command line:
  const std::map<std::string, std::string>& defs =
    this->CTest->GetDefinitions();
  for (auto const& d : defs) {
    this->Makefile->AddDefinition(d.first, d.second);
  }

  // finally read in the script
  if (!this->Makefile->ReadListFile(script) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    // Reset the error flag so that it can run more than
    // one script with an error when you use ctest_run_script.
    cmSystemTools::ResetErrorOccurredFlag();
    return 2;
  }

  return 0;
}